

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

string * __thiscall Catch::TagInfo::all_abi_cxx11_(string *__return_storage_ptr__,TagInfo *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_node_base *p_Var2;
  set<Catch::StringRef,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_> *__range1;
  
  p_Var1 = &(this->spellings)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var2 = (this->spellings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != p_Var1;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  for (p_Var2 = (this->spellings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != p_Var1;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__,*(ulong *)(p_Var2 + 1));
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TagInfo::all() const {
        // 2 per tag for brackets '[' and ']'
        size_t size =  spellings.size() * 2;
        for (auto const& spelling : spellings) {
            size += spelling.size();
        }

        std::string out; out.reserve(size);
        for (auto const& spelling : spellings) {
            out += '[';
            out += spelling;
            out += ']';
        }
        return out;
    }